

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

bool Imath_3_2::extractAndRemoveScalingAndShear<float>
               (Matrix33<float> *mat,Vec2<float> *scl,float *shr,bool exc)

{
  float *scl_00;
  undefined1 auVar1 [16];
  int i;
  float (*pafVar2) [3];
  long lVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  Vec2<float> VVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float maxVal;
  float local_4c;
  Vec2<float> local_48 [2];
  float local_34;
  
  local_48[0].x = *(float *)((long)(mat->x + 0) + 0);
  local_48[0].y = *(float *)((long)(mat->x + 0) + 4);
  local_48[1] = *(Vec2<float> *)mat->x[1];
  local_4c = 0.0;
  lVar4 = 0;
  pafVar2 = (float (*) [3])mat;
  do {
    lVar3 = 0;
    fVar10 = local_4c;
    do {
      local_4c = (*(float (*) [3])*pafVar2)[lVar3];
      if (local_4c <= -local_4c) {
        local_4c = -local_4c;
      }
      if (local_4c <= fVar10) {
        local_4c = fVar10;
      }
      lVar3 = lVar3 + 1;
      fVar10 = local_4c;
    } while (lVar3 == 1);
    pafVar2 = pafVar2 + 1;
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar5);
  if ((local_4c != 0.0) || (NAN(local_4c))) {
    lVar4 = 0;
    do {
      bVar5 = checkForZeroScaleInRow<float>
                        (&local_4c,(Vec2<float> *)((long)&local_48[0].x + lVar4),exc);
      if (!bVar5) {
        return false;
      }
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)((long)&local_48[0].x + lVar4);
      auVar12._4_4_ = local_4c;
      auVar12._0_4_ = local_4c;
      auVar12._8_8_ = 0;
      auVar7 = divps(auVar7,auVar12);
      *(long *)((long)&local_48[0].x + lVar4) = auVar7._0_8_;
      lVar4 = lVar4 + 8;
    } while (lVar4 == 8);
  }
  fVar10 = local_48[0].x * local_48[0].x + local_48[0].y * local_48[0].y;
  if (fVar10 < 2.3509887e-38) {
    extractAndRemoveScalingAndShear<float>();
    fVar10 = local_34;
  }
  else if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  scl->x = fVar10;
  bVar5 = checkForZeroScaleInRow<float>(&scl->x,local_48,exc);
  if (bVar5) {
    fVar10 = scl->x;
    auVar8._4_4_ = fVar10;
    auVar8._0_4_ = fVar10;
    auVar8._8_4_ = fVar10;
    auVar8._12_4_ = fVar10;
    auVar13._8_8_ = 0;
    auVar13._0_4_ = local_48[0].x;
    auVar13._4_4_ = local_48[0].y;
    auVar7 = divps(auVar13,auVar8);
    fVar14 = auVar7._0_4_ * local_48[1].x + auVar7._4_4_ * local_48[1].y;
    *shr = fVar14;
    fVar10 = local_48[1].x - fVar14 * auVar7._0_4_;
    fVar14 = local_48[1].y - fVar14 * auVar7._4_4_;
    local_48[1] = (Vec2<float>)CONCAT44(fVar14,fVar10);
    local_48[0] = auVar7._0_8_;
    fVar10 = fVar10 * fVar10 + fVar14 * fVar14;
    if (fVar10 < 2.3509887e-38) {
      extractAndRemoveScalingAndShear<float>();
    }
    else if (fVar10 < 0.0) {
      local_34 = sqrtf(fVar10);
    }
    else {
      local_34 = SQRT(fVar10);
    }
    scl_00 = &scl->y;
    scl->y = local_34;
    bVar5 = checkForZeroScaleInRow<float>(scl_00,local_48 + 1,exc);
    if (bVar5) {
      fVar10 = *scl_00;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = local_48[1].x;
      auVar9._4_4_ = local_48[1].y;
      auVar1._4_4_ = fVar10;
      auVar1._0_4_ = fVar10;
      auVar1._8_4_ = fVar10;
      auVar1._12_4_ = fVar10;
      auVar7 = divps(auVar9,auVar1);
      uVar6 = auVar7._0_8_;
      local_48[1].x = (float)(int)uVar6;
      local_48[1].y = (float)(int)(uVar6 >> 0x20);
      *shr = *shr / fVar10;
      if (auVar7._4_4_ * local_48[0].x - local_48[0].y * auVar7._0_4_ < 0.0) {
        local_48[1].x = (float)(int)(uVar6 ^ 0x8000000080000000);
        local_48[1].y = (float)(int)((uVar6 ^ 0x8000000080000000) >> 0x20);
        *scl_00 = -*scl_00;
        *shr = -*shr;
      }
      lVar4 = 0;
      do {
        fVar10 = local_48[lVar4].y;
        *(float *)((long)mat + 0) = local_48[lVar4].x;
        *(float *)((long)mat + 4) = fVar10;
        lVar4 = lVar4 + 1;
        mat = (Matrix33<float> *)((long)mat + 0xc);
      } while (lVar4 == 1);
      VVar11.x = local_4c * (*scl).x;
      VVar11.y = local_4c * (*scl).y;
      *scl = VVar11;
      return true;
    }
  }
  return false;
}

Assistant:

bool
extractAndRemoveScalingAndShear (
    Matrix33<T>& mat, Vec2<T>& scl, T& shr, bool exc)
{
    Vec2<T> row[2];

    row[0] = Vec2<T> (mat[0][0], mat[0][1]);
    row[1] = Vec2<T> (mat[1][0], mat[1][1]);

    T maxVal = 0;
    for (int i = 0; i < 2; i++)
        for (int j = 0; j < 2; j++)
            if (IMATH_INTERNAL_NAMESPACE::abs (mat[i][j]) > maxVal)
                maxVal = IMATH_INTERNAL_NAMESPACE::abs (mat[i][j]);

    //
    // We normalize the 2x2 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 2x2 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the
    // scaling factors by maxVal at the end (shear and rotation are not
    // affected by the normalization).

    if (maxVal != 0)
    {
        for (int i = 0; i < 2; i++)
            if (!checkForZeroScaleInRow (maxVal, row[i], exc))
                return false;
            else
                row[i] /= maxVal;
    }

    // Compute X scale factor.
    scl.x = row[0].length ();
    if (!checkForZeroScaleInRow (scl.x, row[0], exc)) return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 2 combinations (XY, YX), although we only extract the XY
    // shear factor because we can effect the an YX shear factor by
    // shearing in XY combined with rotations and scales.
    //
    // shear matrix <   1,  YX,  0,
    //                 XY,   1,  0,
    //                  0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr = row[0].dot (row[1]);
    row[1] -= shr * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (!checkForZeroScaleInRow (scl.y, row[1], exc)) return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y;
    shr /= scl.y;

    // At this point, the upper 2x2 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is -1, then flip the rotation matrix and adjust the scale(Y)
    // and shear(XY) factors to compensate.
    if (row[0].x * row[1].y - row[0].y * row[1].x < 0)
    {
        row[1].x *= -1;
        row[1].y *= -1;
        scl.y *= -1;
        shr *= -1;
    }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 2x2 matrix in mat is now a rotation matrix.
    for (int i = 0; i < 2; i++)
    {
        mat[i][0] = row[i].x;
        mat[i][1] = row[i].y;
    }

    scl *= maxVal;

    return true;
}